

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tang_join_ti_impl.h
# Opt level: O0

bool __thiscall
join::
TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::recursive_partitionable
          (TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
           *this,BinaryNode<label::StringLabel> *curr_node,int delta,int gamma,
          int *nr_of_subgraphs_found)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BinaryNode<label::StringLabel> *curr_node_00;
  BinaryNode<label::StringLabel> *curr_node_01;
  BinaryNode<label::StringLabel> *right_child;
  BinaryNode<label::StringLabel> *left_child;
  int *nr_of_subgraphs_found_local;
  int gamma_local;
  int delta_local;
  BinaryNode<label::StringLabel> *curr_node_local;
  TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *this_local;
  
  node::BinaryNode<label::StringLabel>::set_subgraph_size(curr_node,1);
  node::BinaryNode<label::StringLabel>::set_detached(curr_node,0);
  curr_node_00 = node::BinaryNode<label::StringLabel>::get_left_child(curr_node);
  curr_node_01 = node::BinaryNode<label::StringLabel>::get_right_child(curr_node);
  if (curr_node_00 != (BinaryNode<label::StringLabel> *)0x0) {
    bVar1 = recursive_partitionable(this,curr_node_00,delta,gamma,nr_of_subgraphs_found);
    if (bVar1) {
      return true;
    }
    iVar2 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node);
    iVar3 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node_00);
    node::BinaryNode<label::StringLabel>::set_subgraph_size(curr_node,iVar2 + iVar3);
    iVar2 = node::BinaryNode<label::StringLabel>::get_detached(curr_node);
    iVar3 = node::BinaryNode<label::StringLabel>::get_detached(curr_node_00);
    node::BinaryNode<label::StringLabel>::set_detached(curr_node,iVar2 + iVar3);
  }
  if (curr_node_01 != (BinaryNode<label::StringLabel> *)0x0) {
    bVar1 = recursive_partitionable(this,curr_node_01,delta,gamma,nr_of_subgraphs_found);
    if (bVar1) {
      return true;
    }
    iVar2 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node);
    iVar3 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node_01);
    node::BinaryNode<label::StringLabel>::set_subgraph_size(curr_node,iVar2 + iVar3);
    iVar2 = node::BinaryNode<label::StringLabel>::get_detached(curr_node);
    iVar3 = node::BinaryNode<label::StringLabel>::get_detached(curr_node_01);
    node::BinaryNode<label::StringLabel>::set_detached(curr_node,iVar2 + iVar3);
  }
  iVar2 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node);
  iVar3 = node::BinaryNode<label::StringLabel>::get_detached(curr_node);
  if (gamma <= iVar2 - iVar3) {
    *nr_of_subgraphs_found = *nr_of_subgraphs_found + 1;
    iVar2 = node::BinaryNode<label::StringLabel>::get_subgraph_size(curr_node);
    node::BinaryNode<label::StringLabel>::set_detached(curr_node,iVar2);
    if (delta <= *nr_of_subgraphs_found) {
      return true;
    }
  }
  return false;
}

Assistant:

bool TangJoinTI<Label, VerificationAlgorithm>::recursive_partitionable(
    node::BinaryNode<Label>* curr_node, int delta, int gamma, 
    int& nr_of_subgraphs_found) {
  
  curr_node->set_subgraph_size(1);
  curr_node->set_detached(0);

  node::BinaryNode<Label>* left_child = curr_node->get_left_child();
  node::BinaryNode<Label>* right_child = curr_node->get_right_child();
  if(left_child != nullptr) {
    if(recursive_partitionable(left_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + left_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + left_child->get_detached());
  }
  if(right_child != nullptr) {
    if(recursive_partitionable(right_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + right_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + right_child->get_detached());
  }
  if(curr_node->get_subgraph_size() - curr_node->get_detached() >= gamma) {
    ++nr_of_subgraphs_found;  // identified gamma subtree
    curr_node->set_detached(curr_node->get_subgraph_size());
    if(nr_of_subgraphs_found >= delta)
      return true;  // found (delta, gamma)-partitioning
  }

  return false;
}